

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

void phosg::skip_whitespace_and_comments(StringReader *r,bool disable_extensions)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  
  bVar2 = StringReader::eof(r);
  if (!bVar2) {
    bVar2 = false;
    do {
      pcVar4 = StringReader::pget<signed_char>(r,r->offset,1);
      cVar1 = *pcVar4;
      if (bVar2) {
        bVar2 = cVar1 != '\n' && cVar1 != '\r';
      }
      else if (cVar1 == '/' && !disable_extensions) {
        sVar5 = StringReader::where(r);
        pcVar4 = StringReader::pget<signed_char>(r,sVar5 + 1,1);
        bVar2 = true;
        if (*pcVar4 != '/') {
          return;
        }
      }
      else {
        if (0x17 < (byte)(cVar1 - 9U)) {
          return;
        }
        if ((0x800013U >> ((byte)(cVar1 - 9U) & 0x1f) & 1) == 0) {
          return;
        }
        bVar2 = false;
      }
      StringReader::pget<signed_char>(r,r->offset,1);
      r->offset = r->offset + 1;
      bVar3 = StringReader::eof(r);
    } while (!bVar3);
  }
  return;
}

Assistant:

static void skip_whitespace_and_comments(StringReader& r, bool disable_extensions) {
  bool reading_comment = false;
  while (!r.eof()) {
    char ch = r.get_s8(false);
    if (reading_comment) {
      if ((ch == '\n') || (ch == '\r')) {
        reading_comment = false;
      }
    } else {
      if (!disable_extensions && (ch == '/') && (r.pget_s8(r.where() + 1) == '/')) {
        reading_comment = true;
      } else if ((ch != ' ') && (ch != '\t') && (ch != '\r') && (ch != '\n')) {
        return;
      }
    }
    r.get_s8();
  }
}